

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int iVar1;
  sqlite3 *db_00;
  char *pcVar2;
  undefined8 *in_RDI;
  bool bVar3;
  char *zErr;
  int savedPc;
  sqlite3 *db;
  int cnt;
  Vdbe *v;
  int rc;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sqlite3_stmt *pStmt_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  int local_14;
  int local_4;
  
  iVar5 = 0;
  iVar1 = vdbeSafetyNotNull((Vdbe *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    pStmt_00 = (sqlite3_stmt *)*in_RDI;
    sqlite3_mutex_enter((sqlite3_mutex *)0x13a5e3);
    while( true ) {
      local_14 = sqlite3Step((Vdbe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      bVar3 = local_14 == 0x11;
      iVar1 = iVar5;
      if (bVar3) {
        iVar1 = iVar5 + 1;
      }
      uVar4 = bVar3 && iVar5 < 0x32;
      if (!bVar3 || iVar5 >= 0x32) goto LAB_0013a702;
      in_stack_ffffffffffffffcc = *(int *)(in_RDI + 6);
      iVar5 = sqlite3Reprepare((Vdbe *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      if (iVar5 != 0) break;
      sqlite3_reset(pStmt_00);
      iVar5 = iVar1;
      if (-1 < in_stack_ffffffffffffffcc) {
        *(undefined1 *)((long)in_RDI + 0xc5) = 0xfe;
      }
    }
    db_00 = (sqlite3 *)sqlite3_value_text((sqlite3_value *)0x13a658);
    sqlite3DbFree(db_00,(void *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
    if (pStmt_00[0x67] == (sqlite3_stmt)0x0) {
      pcVar2 = sqlite3DbStrDup((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (char *)db_00);
      in_RDI[0x15] = pcVar2;
      local_14 = sqlite3ApiExit((sqlite3 *)CONCAT17(uVar4,in_stack_ffffffffffffffb8),0);
      *(int *)((long)in_RDI + 0x34) = local_14;
    }
    else {
      in_RDI[0x15] = 0;
      local_14 = 7;
      *(undefined4 *)((long)in_RDI + 0x34) = 7;
    }
LAB_0013a702:
    sqlite3_mutex_leave((sqlite3_mutex *)0x13a710);
    local_4 = local_14;
  }
  else {
    local_4 = sqlite3MisuseError(0);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}